

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall
QAnimationTimer::registerRunningAnimation(QAnimationTimer *this,QAbstractAnimation *animation)

{
  QAbstractAnimationPrivate *pQVar1;
  QList<QAbstractAnimation_*> *in_RSI;
  parameter_type in_RDI;
  
  pQVar1 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x66a275);
  if ((pQVar1->isGroup & 1U) == 0) {
    pQVar1 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x66a28a);
    if ((pQVar1->isPause & 1U) == 0) {
      *(int *)&in_RDI[5].super_QObject.d_ptr.d = *(int *)&in_RDI[5].super_QObject.d_ptr.d + 1;
    }
    else {
      QList<QAbstractAnimation_*>::operator<<(in_RSI,in_RDI);
    }
  }
  return;
}

Assistant:

void QAnimationTimer::registerRunningAnimation(QAbstractAnimation *animation)
{
    if (QAbstractAnimationPrivate::get(animation)->isGroup)
        return;

    if (QAbstractAnimationPrivate::get(animation)->isPause) {
        runningPauseAnimations << animation;
    } else
        runningLeafAnimations++;
}